

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

Expr * __thiscall kratos::Var::duplicate(Var *this,shared_ptr<kratos::Const> *count)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar1;
  undefined4 extraout_var;
  undefined1 local_38 [8];
  shared_ptr<kratos::VarDuplicated> expr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  expr.super___shared_ptr<kratos::VarDuplicated,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::make_shared<kratos::VarDuplicated,kratos::Var*,std::shared_ptr<kratos::Const>const&>
            ((Var **)local_38,
             (shared_ptr<kratos::Const> *)
             &expr.super___shared_ptr<kratos::VarDuplicated,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  iVar1 = (*(this->super_IRNode)._vptr_IRNode[0xd])(this);
  this_00 = &expr.super___shared_ptr<kratos::VarDuplicated,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__shared_ptr<kratos::Expr,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::VarDuplicated,void>
            ((__shared_ptr<kratos::Expr,(__gnu_cxx::_Lock_policy)2> *)this_00,
             (__shared_ptr<kratos::VarDuplicated,_(__gnu_cxx::_Lock_policy)2> *)local_38);
  std::
  _Hashtable<std::shared_ptr<kratos::Expr>,std::shared_ptr<kratos::Expr>,std::allocator<std::shared_ptr<kratos::Expr>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Expr>>,std::hash<std::shared_ptr<kratos::Expr>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<std::shared_ptr<kratos::Expr>const&>
            ((_Hashtable<std::shared_ptr<kratos::Expr>,std::shared_ptr<kratos::Expr>,std::allocator<std::shared_ptr<kratos::Expr>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Expr>>,std::hash<std::shared_ptr<kratos::Expr>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)(CONCAT44(extraout_var,iVar1) + 400),this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&expr);
  return (Expr *)local_38;
}

Assistant:

Expr &Var::duplicate(const std::shared_ptr<Const> &count) const {
    auto expr = std::make_shared<VarDuplicated>(const_cast<Var *>(this), count);
    generator()->add_expr(expr);
    return *expr;
}